

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdflib.c
# Opt level: O2

void bdf_free_font(bdf_font_t *font)

{
  FT_Memory memory;
  bdf_property_t *P;
  ulong uVar1;
  long lVar2;
  bdf_glyph_t *pbVar3;
  anon_union_8_3_ccdffb78_for_value *paVar4;
  
  if (font != (bdf_font_t *)0x0) {
    memory = font->memory;
    ft_mem_free(memory,font->name);
    font->name = (char *)0x0;
    if ((FT_Hash)font->internal != (FT_Hash)0x0) {
      ft_hash_str_free((FT_Hash)font->internal,memory);
      ft_mem_free(memory,font->internal);
      font->internal = (void *)0x0;
    }
    ft_mem_free(memory,font->comments);
    font->comments = (char *)0x0;
    lVar2 = 0x10;
    for (uVar1 = 0; P = font->props, uVar1 < font->props_size; uVar1 = uVar1 + 1) {
      if (*(int *)((long)P + lVar2 + -8) == 1) {
        ft_mem_free(memory,*(void **)((long)&P->name + lVar2));
        *(undefined8 *)((long)&font->props->name + lVar2) = 0;
      }
      lVar2 = lVar2 + 0x18;
    }
    ft_mem_free(memory,P);
    font->props = (bdf_property_t *)0x0;
    pbVar3 = font->glyphs;
    for (uVar1 = 0; uVar1 < font->glyphs_used; uVar1 = uVar1 + 1) {
      ft_mem_free(memory,pbVar3->name);
      pbVar3->name = (char *)0x0;
      ft_mem_free(memory,pbVar3->bitmap);
      pbVar3->bitmap = (uchar *)0x0;
      pbVar3 = pbVar3 + 1;
    }
    pbVar3 = font->unencoded;
    for (uVar1 = 0; uVar1 < font->unencoded_used; uVar1 = uVar1 + 1) {
      ft_mem_free(memory,pbVar3->name);
      pbVar3->name = (char *)0x0;
      ft_mem_free(memory,pbVar3->bitmap);
      pbVar3->bitmap = (uchar *)0x0;
      pbVar3 = pbVar3 + 1;
    }
    ft_mem_free(memory,font->glyphs);
    font->glyphs = (bdf_glyph_t *)0x0;
    ft_mem_free(memory,font->unencoded);
    font->unencoded = (bdf_glyph_t *)0x0;
    pbVar3 = (font->overflow).glyphs;
    for (uVar1 = 0; uVar1 < (font->overflow).glyphs_used; uVar1 = uVar1 + 1) {
      ft_mem_free(memory,pbVar3->name);
      pbVar3->name = (char *)0x0;
      ft_mem_free(memory,pbVar3->bitmap);
      pbVar3->bitmap = (uchar *)0x0;
      pbVar3 = pbVar3 + 1;
    }
    ft_mem_free(memory,(font->overflow).glyphs);
    (font->overflow).glyphs = (bdf_glyph_t *)0x0;
    ft_hash_str_free(&font->proptbl,memory);
    paVar4 = &font->user_props->value;
    for (uVar1 = 0; uVar1 < font->nuser_props; uVar1 = uVar1 + 1) {
      ft_mem_free(memory,((bdf_property_t *)(paVar4 + -2))->name);
      ((bdf_property_t *)(paVar4 + -2))->name = (char *)0x0;
      if (*(int *)(paVar4 + -1) == 1) {
        ft_mem_free(memory,paVar4->atom);
        paVar4->atom = (char *)0x0;
      }
      paVar4 = paVar4 + 3;
    }
    ft_mem_free(memory,font->user_props);
    font->user_props = (bdf_property_t *)0x0;
  }
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  bdf_free_font( bdf_font_t*  font )
  {
    bdf_property_t*  prop;
    unsigned long    i;
    bdf_glyph_t*     glyphs;
    FT_Memory        memory;


    if ( font == 0 )
      return;

    memory = font->memory;

    FT_FREE( font->name );

    /* Free up the internal hash table of property names. */
    if ( font->internal )
    {
      ft_hash_str_free( (FT_Hash)font->internal, memory );
      FT_FREE( font->internal );
    }

    /* Free up the comment info. */
    FT_FREE( font->comments );

    /* Free up the properties. */
    for ( i = 0; i < font->props_size; i++ )
    {
      if ( font->props[i].format == BDF_ATOM )
        FT_FREE( font->props[i].value.atom );
    }

    FT_FREE( font->props );

    /* Free up the character info. */
    for ( i = 0, glyphs = font->glyphs;
          i < font->glyphs_used; i++, glyphs++ )
    {
      FT_FREE( glyphs->name );
      FT_FREE( glyphs->bitmap );
    }

    for ( i = 0, glyphs = font->unencoded; i < font->unencoded_used;
          i++, glyphs++ )
    {
      FT_FREE( glyphs->name );
      FT_FREE( glyphs->bitmap );
    }

    FT_FREE( font->glyphs );
    FT_FREE( font->unencoded );

    /* Free up the overflow storage if it was used. */
    for ( i = 0, glyphs = font->overflow.glyphs;
          i < font->overflow.glyphs_used; i++, glyphs++ )
    {
      FT_FREE( glyphs->name );
      FT_FREE( glyphs->bitmap );
    }

    FT_FREE( font->overflow.glyphs );

    /* bdf_cleanup */
    ft_hash_str_free( &(font->proptbl), memory );

    /* Free up the user defined properties. */
    for ( prop = font->user_props, i = 0;
          i < font->nuser_props; i++, prop++ )
    {
      FT_FREE( prop->name );
      if ( prop->format == BDF_ATOM )
        FT_FREE( prop->value.atom );
    }

    FT_FREE( font->user_props );

    /* FREE( font ); */ /* XXX Fixme */
  }